

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

__pid_t __thiscall kj::Promise<bool>::wait(Promise<bool> *this,void *__stat_loc)

{
  SourceLocation location;
  undefined8 unaff_RBX;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  ExceptionOr<bool> result;
  ExceptionOrValue local_1a8;
  char local_10;
  undefined1 local_f;
  
  local_1a8.exception.ptr.isSet = false;
  local_10 = '\0';
  location.function = (char *)in_stack_00000010;
  location.fileName = (char *)in_stack_00000008;
  location._16_8_ = in_stack_00000018;
  kj::_::waitImpl((OwnPromiseNode *)this,&local_1a8,(WaitScope *)__stat_loc,location);
  if (local_10 == '\x01') {
    if (local_1a8.exception.ptr.isSet != false) {
      throwRecoverableException(&local_1a8.exception.ptr.field_1.value,0);
    }
    if ((local_1a8.exception.ptr.isSet & 1U) != 0) {
      Exception::~Exception(&local_1a8.exception.ptr.field_1.value);
    }
    return (__pid_t)CONCAT71((int7)((ulong)unaff_RBX >> 8),local_f);
  }
  if (local_1a8.exception.ptr.isSet != false) {
    throwFatalException(&local_1a8.exception.ptr.field_1.value,0);
  }
  kj::_::unreachable();
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope, SourceLocation location) {
  _::ExceptionOr<_::FixVoid<T>> result;
  _::waitImpl(kj::mv(node), result, waitScope, location);
  return convertToReturn(kj::mv(result));
}